

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O1

void __thiscall LongReadsDatastore::print_status(LongReadsDatastore *this)

{
  long lVar1;
  unsigned_long uVar2;
  pointer puVar3;
  ostream *poVar4;
  pointer pRVar5;
  ostream *poVar6;
  long lVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  ulong uVar8;
  pointer puVar9;
  unsigned_long *puVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> read_sizes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  LongReadsDatastore *local_88;
  double local_80;
  double local_78;
  unsigned_long *local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  unsigned_long *local_48;
  unsigned_long *local_40;
  unsigned_long *local_38;
  
  lVar11 = 0;
  poVar4 = sdglib::OutputLog(INFO,false);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  pRVar5 = (this->read_to_fileRecord).super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_88 = this;
  if ((long)(this->read_to_fileRecord).super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5 != 0x10) {
    lVar7 = 0x18;
    uVar8 = 0;
    lVar11 = 0;
    do {
      puVar10 = (unsigned_long *)(ulong)*(uint *)((long)&pRVar5->offset + lVar7);
      local_70 = puVar10;
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_70);
      }
      else {
        *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)puVar10;
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      lVar11 = lVar11 + (long)puVar10;
      pRVar5 = (local_88->read_to_fileRecord).
               super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar8 < ((long)(local_88->read_to_fileRecord).
                            super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pRVar5 >> 4) - 1U);
  }
  puVar9 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    local_70 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_38 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar8 = (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    lVar7 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (&local_70,&local_38,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    local_40 = puVar9;
    local_48 = puVar3;
    std::
    __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
  }
  poVar6 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"The datastore on ",0x11);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(local_88->filename)._M_dataplus._M_p,
                      (local_88->filename)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," contains ",10);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," reads with ",0xc);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"bp, ",4);
  puVar3 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    auVar12._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar12._0_8_ = lVar11;
    auVar12._12_4_ = 0x45300000;
    dStack_60 = auVar12._8_8_ - 1.9342813113834067e+25;
    local_68 = dStack_60 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    local_78 = local_68 * 0.2;
    local_80 = local_68 * 0.5;
    local_68 = local_68 * 0.8;
    lVar7 = 0;
    puVar9 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar2 = *puVar9;
      if (lVar7 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"N0: ",4);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"bp  ",4);
      }
      auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar13._0_8_ = lVar7;
      auVar13._12_4_ = 0x45300000;
      dStack_50 = auVar13._8_8_ - 1.9342813113834067e+25;
      local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
      if ((local_58 < local_78) &&
         (lVar1 = uVar2 + lVar7, auVar14._8_4_ = (int)((ulong)lVar1 >> 0x20), auVar14._0_8_ = lVar1,
         auVar14._12_4_ = 0x45300000,
         local_78 <
         (auVar14._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"N20: ",5);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"bp  ",4);
      }
      if ((local_58 < local_80) &&
         (lVar1 = uVar2 + lVar7, auVar15._8_4_ = (int)((ulong)lVar1 >> 0x20), auVar15._0_8_ = lVar1,
         auVar15._12_4_ = 0x45300000,
         local_80 <
         (auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"N50: ",5);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"bp  ",4);
      }
      if ((local_58 < local_68) &&
         (lVar1 = uVar2 + lVar7, auVar16._8_4_ = (int)((ulong)lVar1 >> 0x20), auVar16._0_8_ = lVar1,
         auVar16._12_4_ = 0x45300000,
         local_68 <
         (auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"N80: ",5);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"bp  ",4);
      }
      lVar7 = lVar7 + uVar2;
      if (lVar7 == lVar11) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"N100: ",6);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"bp  ",4);
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar3);
  }
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  LongReadsMapper::print_status(&local_88->mapper);
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LongReadsDatastore::print_status() const {
    auto &log_no_date=sdglib::OutputLog(sdglib::LogLevels::INFO,false);
    std::vector<uint64_t> read_sizes;
    uint64_t total_size=0;
    for (auto ri=1;ri<=size();++ri) {
        auto s=read_to_fileRecord[ri].record_size;
            total_size += s;
            read_sizes.push_back(s);
    }
    std::sort(read_sizes.rbegin(),read_sizes.rend());
    auto on20s=total_size*.2;
    auto on50s=total_size*.5;
    auto on80s=total_size*.8;
    sdglib::OutputLog() <<"The datastore on " << filename << " contains "<<read_sizes.size()<<" reads with "<<total_size<<"bp, ";
    uint64_t acc=0;
    for (auto s:read_sizes){
        if (acc==0)  log_no_date<<"N0: "<<s<<"bp  ";
        if (acc<on20s and acc+s>on20s) log_no_date<<"N20: "<<s<<"bp  ";
        if (acc<on50s and acc+s>on50s) log_no_date<<"N50: "<<s<<"bp  ";
        if (acc<on80s and acc+s>on80s) log_no_date<<"N80: "<<s<<"bp  ";
        acc+=s;
        if (acc==total_size)  log_no_date<<"N100: "<<s<<"bp  ";
    }
    log_no_date<<std::endl;

    mapper.print_status();
}